

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

double __thiscall vera::gamma(vera *this,double param_1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  undefined4 *puVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double dVar7;
  undefined4 local_1c;
  int i;
  int total;
  float _gamma_local;
  Image *_image_local;
  
  iVar1 = (**(code **)(*(long *)this + 0x30))();
  iVar2 = (**(code **)(*(long *)this + 0x38))();
  iVar3 = (**(code **)(*(long *)this + 0x40))();
  dVar7 = extraout_XMM0_Qa;
  for (local_1c = 0; local_1c < iVar1 * iVar2 * iVar3; local_1c = local_1c + 1) {
    puVar4 = (uint *)(**(code **)(*(long *)this + 0x60))(this,local_1c);
    dVar6 = std::pow((double)(ulong)*puVar4,(double)((ulong)param_1 & 0xffffffff));
    puVar5 = (undefined4 *)(**(code **)(*(long *)this + 0x60))(this,local_1c);
    dVar7 = (double)((ulong)dVar6 & 0xffffffff);
    *puVar5 = SUB84(dVar6,0);
  }
  return dVar7;
}

Assistant:

void gamma(Image& _image, float _gamma) {
    int total = _image.getWidth() * _image.getHeight() * _image.getChannels();
    for (int i = 0; i < total; i++)
        _image[i] = std::pow(_image[i], _gamma);
}